

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void shunt_map_down_left(tgestate_t *state)

{
  long in_RDI;
  tgestate_t *in_stack_00000010;
  
  *(char *)(in_RDI + 0x691) = *(char *)(in_RDI + 0x691) + '\x01';
  *(char *)(in_RDI + 0x692) = *(char *)(in_RDI + 0x692) + -1;
  get_supertiles(in_stack_00000010);
  memmove((void *)(*(long *)(in_RDI + 0x790) + 0x18),(void *)(*(long *)(in_RDI + 0x790) + 1),0x17f);
  memmove((void *)(*(long *)(in_RDI + 0x7a0) + 0xc0),(void *)(*(long *)(in_RDI + 0x7a0) + 1),0xbff);
  plot_topmost_tiles(in_stack_00000010);
  plot_rightmost_tiles(in_stack_00000010);
  return;
}

Assistant:

void shunt_map_down_left(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.x++;
  state->map_position.y--;

  get_supertiles(state);

  memmove(&state->tile_buf[24], &state->tile_buf[1], TILE_BUF_LENGTH - 24 - 1);
  memmove(&state->window_buf[24 * 8], &state->window_buf[1], WINDOW_BUF_LENGTH - 24 * 8 - 1);

  plot_topmost_tiles(state);
  plot_rightmost_tiles(state);
}